

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

Vec_Str_t * Scl_LibertyReadSclStr(Scl_Tree_t *p,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  void **ppvVar2;
  Scl_Item_t *pTiming;
  double dVar3;
  uint uVar4;
  __time_t vOut;
  Vec_Ptr_t *vOut_00;
  Vec_Flt_t *__ptr;
  Vec_Flt_t *__ptr_00;
  Vec_Flt_t *__ptr_01;
  int iVar5;
  uint uVar6;
  int iVar7;
  Vec_Ptr_t *vTemples;
  Vec_Str_t *vOut_01;
  char *pcVar8;
  uint *__ptr_02;
  void *pvVar9;
  size_t sVar10;
  char *__dest;
  Scl_Item_t *pSVar11;
  Vec_Wrd_t *__ptr_03;
  Vec_Ptr_t *pVVar12;
  undefined8 *puVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  Scl_Item_t *pSVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Vec_Ptr_t *vTables [4];
  Vec_Flt_t *vValues;
  Vec_Flt_t *vInd1;
  Vec_Flt_t *vInd0;
  uint local_10c;
  int local_ec;
  ulong local_d8;
  timespec local_78;
  Vec_Ptr_t *local_68;
  Vec_Ptr_t *local_60;
  Vec_Ptr_t *local_58;
  char **local_50;
  Vec_Flt_t *local_48;
  Vec_Flt_t *local_40;
  Vec_Flt_t *local_38;
  
  vTemples = Scl_LibertyReadTemplates(p);
  vOut_01 = (Vec_Str_t *)malloc(0x10);
  vOut_01->nCap = 10000;
  vOut_01->nSize = 0;
  pcVar8 = (char *)malloc(10000);
  vOut_01->pArray = pcVar8;
  vOut_01->nSize = 1;
  *pcVar8 = '\b';
  pcVar8 = Scl_LibertyReadString(p,p->pItems->Head);
  Vec_StrPutS_(vOut_01,pcVar8);
  pcVar8 = Scl_LibertyReadDefaultWireLoad(p);
  Vec_StrPutS_(vOut_01,pcVar8);
  pcVar8 = Scl_LibertyReadDefaultWireLoadSel(p);
  Vec_StrPutS_(vOut_01,pcVar8);
  fVar22 = Scl_LibertyReadDefaultMaxTrans(p);
  Vec_StrPutF_(vOut_01,fVar22);
  iVar5 = Scl_LibertyReadTimeUnit(p);
  Vec_StrPutI_(vOut_01,iVar5);
  Scl_LibertyReadLoadUnit(p,vOut_01);
  Scl_LibertyReadWireLoad(p,vOut_01);
  Scl_LibertyReadWireLoadSelect(p,vOut_01);
  pSVar17 = p->pItems;
  uVar1 = pSVar17->Child;
  if ((int)uVar1 < p->nItems) {
    local_10c = 0;
    local_d8 = 0;
    uVar20 = 0;
    local_ec = 0;
    if (pSVar17 != (Scl_Item_t *)0x0 && -1 < (int)uVar1) {
      pSVar17 = pSVar17 + uVar1;
      local_ec = 0;
      uVar20 = 0;
      local_d8 = 0;
      local_10c = 0;
      do {
        iVar5 = (pSVar17->Key).Beg;
        iVar7 = (pSVar17->Key).End - iVar5;
        iVar5 = strncmp(p->pContents + iVar5,"cell",(long)iVar7);
        if (iVar7 == 4 && iVar5 == 0) {
          iVar5 = Scl_LibertyReadCellIsFlop(p,pSVar17);
          if (iVar5 == 0) {
            iVar5 = Scl_LibertyReadCellIsThreeState(p,pSVar17);
            if (iVar5 == 0) {
              iVar5 = Scl_LibertyReadCellOutputNum(p,pSVar17);
              if (iVar5 == 0) {
                if (fVeryVerbose != 0) {
                  pcVar8 = Scl_LibertyReadString(p,pSVar17->Head);
                  printf("Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n",
                         pcVar8);
                }
                local_ec = local_ec + 1;
              }
              else {
                local_10c = local_10c + 1;
              }
            }
            else {
              if (fVeryVerbose != 0) {
                pcVar8 = Scl_LibertyReadString(p,pSVar17->Head);
                printf("Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n",pcVar8);
              }
              uVar20 = (ulong)((int)uVar20 + 1);
            }
          }
          else {
            if (fVeryVerbose != 0) {
              pcVar8 = Scl_LibertyReadString(p,pSVar17->Head);
              printf("Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n",pcVar8);
            }
            local_d8 = (ulong)((int)local_d8 + 1);
          }
        }
        uVar1 = pSVar17->Next;
        if (p->nItems <= (int)uVar1) goto LAB_003ea024;
        if ((int)uVar1 < 0) {
          pSVar17 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar17 = p->pItems + uVar1;
        }
      } while (pSVar17 != (Scl_Item_t *)0x0);
    }
    Vec_StrPutI_(vOut_01,local_10c);
    pSVar17 = p->pItems;
    uVar1 = pSVar17->Child;
    if ((int)uVar1 < p->nItems) {
      if (pSVar17 != (Scl_Item_t *)0x0 && -1 < (int)uVar1) {
        pSVar17 = pSVar17 + uVar1;
        do {
          iVar5 = (pSVar17->Key).Beg;
          iVar7 = (pSVar17->Key).End - iVar5;
          iVar5 = strncmp(p->pContents + iVar5,"cell",(long)iVar7);
          if ((((iVar7 == 4 && iVar5 == 0) &&
               (iVar5 = Scl_LibertyReadCellIsFlop(p,pSVar17), iVar5 == 0)) &&
              (iVar5 = Scl_LibertyReadCellIsThreeState(p,pSVar17), iVar5 == 0)) &&
             (iVar5 = Scl_LibertyReadCellOutputNum(p,pSVar17), iVar5 != 0)) {
            pcVar8 = Scl_LibertyReadString(p,pSVar17->Head);
            Vec_StrPutS_(vOut_01,pcVar8);
            pcVar8 = Scl_LibertyReadCellArea(p,pSVar17);
            fVar22 = 1.0;
            if (pcVar8 != (char *)0x0) {
              dVar3 = atof(pcVar8);
              fVar22 = (float)dVar3;
            }
            Vec_StrPutF_(vOut_01,fVar22);
            pcVar8 = Scl_LibertyReadCellLeakage(p,pSVar17);
            if (pcVar8 == (char *)0x0) {
              fVar22 = 0.0;
            }
            else {
              dVar3 = atof(pcVar8);
              fVar22 = (float)dVar3;
            }
            Vec_StrPutF_(vOut_01,fVar22);
            iVar5 = Scl_LibertyReadDeriveStrength(p,pSVar17);
            Vec_StrPutI_(vOut_01,iVar5);
            iVar5 = Scl_LibertyReadCellOutputNum(p,pSVar17);
            iVar7 = Scl_LibertyItemNum(p,pSVar17,"pin");
            Vec_StrPutI_(vOut_01,iVar7 - iVar5);
            Vec_StrPutI_(vOut_01,iVar5);
            __ptr_02 = (uint *)malloc(0x10);
            __ptr_02[0] = 0x10;
            __ptr_02[1] = 0;
            pvVar9 = malloc(0x80);
            *(void **)(__ptr_02 + 2) = pvVar9;
            uVar1 = pSVar17->Child;
            if (p->nItems <= (int)uVar1) goto LAB_003ea024;
            if ((int)uVar1 < 0) {
              pSVar11 = (Scl_Item_t *)0x0;
            }
            else {
              pSVar11 = p->pItems + uVar1;
            }
            while (pSVar11 != (Scl_Item_t *)0x0) {
              iVar5 = (pSVar11->Key).Beg;
              iVar7 = (pSVar11->Key).End - iVar5;
              iVar5 = strncmp(p->pContents + iVar5,"pin",(long)iVar7);
              if ((iVar7 == 3 && iVar5 == 0) &&
                 (pcVar8 = Scl_LibertyReadPinFormula(p,pSVar11), pcVar8 == (char *)0x0)) {
                iVar5 = Scl_LibertyReadPinDirection(p,pSVar11);
                if (iVar5 != 0) {
                  __assert_fail("Scl_LibertyReadPinDirection(p, pPin) == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                                ,0x5d1,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
                }
                pcVar8 = Scl_LibertyReadString(p,pSVar11->Head);
                sVar10 = strlen(pcVar8);
                __dest = (char *)malloc(sVar10 + 1);
                strcpy(__dest,pcVar8);
                uVar1 = __ptr_02[1];
                uVar6 = *__ptr_02;
                if (uVar1 == uVar6) {
                  if ((int)uVar6 < 0x10) {
                    if (*(void **)(__ptr_02 + 2) == (void *)0x0) {
                      pvVar9 = malloc(0x80);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr_02 + 2),0x80);
                    }
                    uVar15 = 0x10;
                  }
                  else {
                    uVar15 = uVar6 * 2;
                    if ((int)uVar15 <= (int)uVar6) goto LAB_003e9824;
                    if (*(void **)(__ptr_02 + 2) == (void *)0x0) {
                      pvVar9 = malloc((ulong)uVar6 << 4);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr_02 + 2),(ulong)uVar6 << 4);
                    }
                  }
                  *(void **)(__ptr_02 + 2) = pvVar9;
                  *__ptr_02 = uVar15;
                }
LAB_003e9824:
                __ptr_02[1] = uVar1 + 1;
                *(char **)(*(long *)(__ptr_02 + 2) + (long)(int)uVar1 * 8) = __dest;
                Vec_StrPutS_(vOut_01,pcVar8);
                fVar22 = Scl_LibertyReadPinCap(p,pSVar11,"capacitance");
                fVar23 = Scl_LibertyReadPinCap(p,pSVar11,"rise_capacitance");
                fVar24 = Scl_LibertyReadPinCap(p,pSVar11,"fall_capacitance");
                Vec_StrPutF_(vOut_01,(float)(~-(uint)(fVar23 == 0.0) & (uint)fVar23 |
                                            -(uint)(fVar23 == 0.0) & (uint)fVar22));
                Vec_StrPutF_(vOut_01,(float)(~-(uint)(fVar24 == 0.0) & (uint)fVar24 |
                                            (uint)fVar22 & -(uint)(fVar24 == 0.0)));
              }
              uVar1 = pSVar11->Next;
              if (p->nItems <= (int)uVar1) goto LAB_003ea024;
              if ((int)uVar1 < 0) {
                pSVar11 = (Scl_Item_t *)0x0;
              }
              else {
                pSVar11 = p->pItems + uVar1;
              }
            }
            uVar1 = pSVar17->Child;
            while( true ) {
              if (p->nItems <= (int)uVar1) goto LAB_003ea024;
              if ((int)uVar1 < 0) {
                pSVar11 = (Scl_Item_t *)0x0;
              }
              else {
                pSVar11 = p->pItems + uVar1;
              }
              if (pSVar11 == (Scl_Item_t *)0x0) break;
              iVar5 = (pSVar11->Key).Beg;
              iVar7 = (pSVar11->Key).End - iVar5;
              iVar5 = strncmp(p->pContents + iVar5,"pin",(long)iVar7);
              if ((iVar7 == 3 && iVar5 == 0) &&
                 (pcVar8 = Scl_LibertyReadPinFormula(p,pSVar11), pcVar8 != (char *)0x0)) {
                iVar5 = Scl_LibertyReadPinDirection(p,pSVar11);
                if (iVar5 != 1) {
                  __assert_fail("Scl_LibertyReadPinDirection(p, pPin) == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                                ,0x5e6,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
                }
                pcVar8 = Scl_LibertyReadString(p,pSVar11->Head);
                Vec_StrPutS_(vOut_01,pcVar8);
                fVar22 = Scl_LibertyReadPinCap(p,pSVar11,"max_capacitance");
                Vec_StrPutF_(vOut_01,fVar22);
                fVar22 = Scl_LibertyReadPinCap(p,pSVar11,"max_transition");
                Vec_StrPutF_(vOut_01,fVar22);
                uVar1 = __ptr_02[1];
                Vec_StrPutI_(vOut_01,uVar1);
                pcVar8 = Scl_LibertyReadPinFormula(p,pSVar11);
                Vec_StrPutS_(vOut_01,pcVar8);
                local_50 = *(char ***)(__ptr_02 + 2);
                __ptr_03 = Mio_ParseFormulaTruth(pcVar8,local_50,uVar1);
                if (__ptr_03 == (Vec_Wrd_t *)0x0) {
                  return (Vec_Str_t *)0x0;
                }
                uVar6 = 1 << ((char)uVar1 - 6U & 0x1f);
                if ((int)uVar1 < 7) {
                  uVar6 = 1;
                }
                if (0 < (int)uVar6) {
                  uVar16 = 0;
                  do {
                    if ((long)__ptr_03->nSize <= (long)uVar16) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                                    ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
                    }
                    uVar21 = __ptr_03->pArray[uVar16];
                    lVar18 = (long)vOut_01->nSize;
                    uVar15 = vOut_01->nCap;
                    pcVar8 = vOut_01->pArray;
                    lVar14 = 0;
                    do {
                      if ((uint)lVar18 == uVar15) {
                        if ((int)uVar15 < 0x10) {
                          if (pcVar8 == (char *)0x0) {
                            pcVar8 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar8 = (char *)realloc(pcVar8,0x10);
                          }
                          uVar15 = 0x10;
                        }
                        else {
                          uVar4 = uVar15 * 2;
                          if (SBORROW4(uVar15,uVar4) != 0 < (int)uVar15) {
                            uVar15 = uVar4;
                            if (pcVar8 == (char *)0x0) {
                              pcVar8 = (char *)malloc((ulong)uVar4);
                            }
                            else {
                              pcVar8 = (char *)realloc(pcVar8,(ulong)uVar4);
                            }
                          }
                        }
                      }
                      pcVar8[lVar18] = (char)(uVar21 >> ((byte)lVar14 & 0x3f));
                      lVar18 = lVar18 + 1;
                      lVar14 = lVar14 + 8;
                    } while (lVar14 != 0x40);
                    vOut_01->nSize = (int)lVar18;
                    vOut_01->nCap = uVar15;
                    vOut_01->pArray = pcVar8;
                    uVar16 = uVar16 + 1;
                  } while (uVar16 != uVar6);
                }
                if (__ptr_03->pArray != (word *)0x0) {
                  free(__ptr_03->pArray);
                  __ptr_03->pArray = (word *)0x0;
                }
                free(__ptr_03);
                if (0 < (int)uVar1) {
                  uVar16 = 0;
                  do {
                    pcVar8 = local_50[uVar16];
                    pVVar12 = Scl_LibertyReadPinTimingAll(p,pSVar11,pcVar8);
                    Vec_StrPutS_(vOut_01,pcVar8);
                    uVar6 = pVVar12->nSize;
                    uVar21 = (ulong)uVar6;
                    Vec_StrPutI_(vOut_01,(uint)(uVar21 != 0));
                    if (uVar21 == 0) {
                      if (pVVar12->pArray != (void **)0x0) {
                        free(pVVar12->pArray);
                        pVVar12->pArray = (void **)0x0;
                      }
                      iVar5 = 0x16;
                      if (pVVar12 != (Vec_Ptr_t *)0x0) {
                        free(pVVar12);
                      }
                    }
                    else {
                      if ((int)uVar6 < 1) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                      }
                      ppvVar2 = pVVar12->pArray;
                      local_58 = pVVar12;
                      iVar5 = Scl_LibertyReadTimingSense(p,(Scl_Item_t *)*ppvVar2);
                      Vec_StrPutI_(vOut_01,iVar5);
                      lVar14 = 0;
                      do {
                        puVar13 = (undefined8 *)malloc(0x10);
                        *puVar13 = 0x10;
                        pvVar9 = malloc(0x80);
                        puVar13[1] = pvVar9;
                        (&local_78.tv_sec)[lVar14] = (__time_t)puVar13;
                        vOut_00 = local_60;
                        pVVar12 = local_68;
                        lVar18 = local_78.tv_nsec;
                        vOut = local_78.tv_sec;
                        lVar14 = lVar14 + 1;
                      } while (lVar14 != 4);
                      uVar19 = 0;
                      do {
                        pTiming = (Scl_Item_t *)ppvVar2[uVar19];
                        iVar5 = Scl_LibertyScanTable
                                          (p,(Vec_Ptr_t *)vOut,pTiming,"cell_rise",vTemples);
                        if (((((iVar5 == 0) &&
                              (iVar5 = Scl_LibertyScanTable
                                                 (p,(Vec_Ptr_t *)vOut,pTiming,"cell_fall",vTemples),
                              iVar5 == 0)) ||
                             ((iVar5 = Scl_LibertyScanTable
                                                 (p,(Vec_Ptr_t *)lVar18,pTiming,"cell_fall",vTemples
                                                 ), iVar5 == 0 &&
                              (iVar5 = Scl_LibertyScanTable
                                                 (p,(Vec_Ptr_t *)lVar18,pTiming,"cell_rise",vTemples
                                                 ), iVar5 == 0)))) ||
                            ((iVar5 = Scl_LibertyScanTable
                                                (p,pVVar12,pTiming,"rise_transition",vTemples),
                             iVar5 == 0 &&
                             (iVar5 = Scl_LibertyScanTable
                                                (p,pVVar12,pTiming,"fall_transition",vTemples),
                             iVar5 == 0)))) ||
                           ((iVar5 = Scl_LibertyScanTable
                                               (p,vOut_00,pTiming,"fall_transition",vTemples),
                            iVar5 == 0 &&
                            (iVar5 = Scl_LibertyScanTable
                                               (p,vOut_00,pTiming,"rise_transition",vTemples),
                            iVar5 == 0)))) {
                          puts("Table cannot be found");
                          iVar5 = 1;
                          goto LAB_003e9f27;
                        }
                        uVar19 = uVar19 + 1;
                      } while (uVar21 != uVar19);
                      free(ppvVar2);
                      local_58->pArray = (void **)0x0;
                      if (local_58 != (Vec_Ptr_t *)0x0) {
                        free(local_58);
                      }
                      lVar14 = 0;
                      do {
                        pVVar12 = (Vec_Ptr_t *)(&local_78.tv_sec)[lVar14];
                        Scl_LibertyComputeWorstCase(pVVar12,&local_38,&local_40,&local_48);
                        if (0 < pVVar12->nSize) {
                          lVar18 = 0;
                          do {
                            pvVar9 = pVVar12->pArray[lVar18];
                            if (pvVar9 != (void *)0x0) {
                              if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
                                free(*(void **)((long)pvVar9 + 8));
                                *(undefined8 *)((long)pvVar9 + 8) = 0;
                              }
                              free(pvVar9);
                            }
                            lVar18 = lVar18 + 1;
                          } while (lVar18 < pVVar12->nSize);
                        }
                        if (pVVar12->pArray != (void **)0x0) {
                          free(pVVar12->pArray);
                          pVVar12->pArray = (void **)0x0;
                        }
                        if (pVVar12 != (Vec_Ptr_t *)0x0) {
                          free(pVVar12);
                        }
                        __ptr_01 = local_38;
                        __ptr_00 = local_40;
                        __ptr = local_48;
                        Scl_LibertyDumpTables(vOut_01,local_38,local_40,local_48);
                        if (__ptr_01->pArray != (float *)0x0) {
                          free(__ptr_01->pArray);
                          __ptr_01->pArray = (float *)0x0;
                        }
                        if (__ptr_01 != (Vec_Flt_t *)0x0) {
                          free(__ptr_01);
                        }
                        if (__ptr_00->pArray != (float *)0x0) {
                          free(__ptr_00->pArray);
                          __ptr_00->pArray = (float *)0x0;
                        }
                        if (__ptr_00 != (Vec_Flt_t *)0x0) {
                          free(__ptr_00);
                        }
                        if (__ptr->pArray != (float *)0x0) {
                          free(__ptr->pArray);
                          __ptr->pArray = (float *)0x0;
                        }
                        if (__ptr != (Vec_Flt_t *)0x0) {
                          free(__ptr);
                        }
                        lVar14 = lVar14 + 1;
                      } while (lVar14 != 4);
                      iVar5 = 0;
                    }
LAB_003e9f27:
                    if ((iVar5 != 0x16) && (iVar5 != 0)) {
                      return (Vec_Str_t *)0x0;
                    }
                    uVar16 = uVar16 + 1;
                  } while (uVar16 != uVar1);
                }
              }
              uVar1 = pSVar11->Next;
            }
            uVar1 = __ptr_02[1];
            if (0 < (long)(int)uVar1) {
              lVar14 = *(long *)(__ptr_02 + 2);
              lVar18 = 0;
              do {
                pvVar9 = *(void **)(lVar14 + lVar18 * 8);
                if ((void *)0x2 < pvVar9) {
                  free(pvVar9);
                }
                lVar18 = lVar18 + 1;
              } while ((int)uVar1 != lVar18);
            }
            if (*(void **)(__ptr_02 + 2) != (void *)0x0) {
              free(*(void **)(__ptr_02 + 2));
              __ptr_02[2] = 0;
              __ptr_02[3] = 0;
            }
            free(__ptr_02);
          }
          uVar1 = pSVar17->Next;
          if (p->nItems <= (int)uVar1) goto LAB_003ea024;
          if ((int)uVar1 < 0) {
            pSVar17 = (Scl_Item_t *)0x0;
          }
          else {
            pSVar17 = p->pItems + uVar1;
          }
        } while (pSVar17 != (Scl_Item_t *)0x0);
      }
      if (vTemples != (Vec_Ptr_t *)0x0) {
        uVar1 = vTemples->nSize;
        if ((uVar1 & 3) != 0) {
          __assert_fail("Vec_PtrSize(vTemples) % 4 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                        ,0x64f,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
        }
        if (0 < (int)uVar1) {
          ppvVar2 = vTemples->pArray;
          uVar16 = 0;
          do {
            pvVar9 = ppvVar2[uVar16];
            uVar6 = (uint)uVar16 & 3;
            if (uVar6 - 2 < 2) {
              if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar9 + 8));
                *(undefined8 *)((long)pvVar9 + 8) = 0;
              }
LAB_003e9349:
              if (pvVar9 != (void *)0x0) {
                free(pvVar9);
              }
            }
            else if (uVar6 != 1) goto LAB_003e9349;
            uVar16 = uVar16 + 1;
          } while (uVar1 != uVar16);
        }
        if (vTemples->pArray != (void **)0x0) {
          free(vTemples->pArray);
          vTemples->pArray = (void **)0x0;
        }
        free(vTemples);
      }
      if (fVerbose != 0) {
        pcVar8 = Scl_LibertyReadString(p,p->pItems->Head);
        printf("Library \"%s\" from \"%s\" has %d cells ",pcVar8,p->pFileName,(ulong)local_10c);
        printf("(%d skipped: %d seq; %d tri-state; %d no func).  ",
               (ulong)(uint)((int)uVar20 + (int)local_d8 + local_ec),local_d8,uVar20);
        iVar5 = clock_gettime(3,&local_78);
        if (iVar5 < 0) {
          lVar14 = -1;
        }
        else {
          lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
        }
        lVar18 = p->clkStart;
        Abc_Print(1,"%s =","Time");
        Abc_Print(1,"%9.2f sec\n",SUB84((double)(lVar14 - lVar18) / 1000000.0,0));
      }
      return vOut_01;
    }
  }
LAB_003ea024:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

Vec_Str_t * Scl_LibertyReadSclStr( Scl_Tree_t * p, int fVerbose, int fVeryVerbose )
{
    int fUseFirstTable = 0;
    Vec_Str_t * vOut;
    Vec_Ptr_t * vNameIns, * vTemples = NULL;
    Scl_Item_t * pCell, * pPin, * pTiming;
    Vec_Wrd_t * vTruth;
    char * pFormula, * pName;
    int i, k, Counter, nOutputs, nCells;
    int nSkipped[3] = {0};

    // read delay-table templates
    vTemples = Scl_LibertyReadTemplates( p );

    // start the library
    vOut = Vec_StrAlloc( 10000 );
    Vec_StrPutI_( vOut, ABC_SCL_CUR_VERSION );

    // top level information
    Vec_StrPut_( vOut );
    Vec_StrPutS_( vOut, Scl_LibertyReadString(p, Scl_LibertyRoot(p)->Head) );
    Vec_StrPutS_( vOut, Scl_LibertyReadDefaultWireLoad(p) );
    Vec_StrPutS_( vOut, Scl_LibertyReadDefaultWireLoadSel(p) );
    Vec_StrPutF_( vOut, Scl_LibertyReadDefaultMaxTrans(p) );
    Vec_StrPutI_( vOut, Scl_LibertyReadTimeUnit(p) );
    Scl_LibertyReadLoadUnit( p, vOut );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );

    // read wire loads
    Scl_LibertyReadWireLoad( p, vOut );
    Scl_LibertyReadWireLoadSelect( p, vOut );

    // count cells
    nCells = 0;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[0]++;
            continue;
        }
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[1]++;
            continue;
        }
        if ( (Counter = Scl_LibertyReadCellOutputNum(p, pCell)) == 0 )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[2]++;
            continue;
        }
        nCells++;
    }
    // read cells
    Vec_StrPutI_( vOut, nCells );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
            continue;
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
            continue;
        if ( (Counter = Scl_LibertyReadCellOutputNum(p, pCell)) == 0 )
            continue;
        // top level information
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pCell->Head) );
        pName = Scl_LibertyReadCellArea(p, pCell);
        Vec_StrPutF_( vOut, pName ? atof(pName) : 1 );
        pName = Scl_LibertyReadCellLeakage(p, pCell);
        Vec_StrPutF_( vOut, pName ? atof(pName) : 0 );
        Vec_StrPutI_( vOut, Scl_LibertyReadDeriveStrength(p, pCell) );
        // pin count
        nOutputs = Scl_LibertyReadCellOutputNum( p, pCell );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pCell, "pin") - nOutputs );
        Vec_StrPutI_( vOut, nOutputs );
        Vec_StrPut_( vOut );
        Vec_StrPut_( vOut );

        // input pins
        vNameIns = Vec_PtrAlloc( 16 );
        Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        {
            float CapOne, CapRise, CapFall;
            if ( Scl_LibertyReadPinFormula(p, pPin) != NULL ) // skip output pin
                continue;
            assert( Scl_LibertyReadPinDirection(p, pPin) == 0 );
            pName = Scl_LibertyReadString(p, pPin->Head);
            Vec_PtrPush( vNameIns, Abc_UtilStrsav(pName) );
            Vec_StrPutS_( vOut, pName );
            CapOne  = Scl_LibertyReadPinCap( p, pPin, "capacitance" );
            CapRise = Scl_LibertyReadPinCap( p, pPin, "rise_capacitance" );
            CapFall = Scl_LibertyReadPinCap( p, pPin, "fall_capacitance" );
            if ( CapRise == 0 )
                CapRise = CapOne;
            if ( CapFall == 0 )
                CapFall = CapOne;
            Vec_StrPutF_( vOut, CapRise );
            Vec_StrPutF_( vOut, CapFall );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
        // output pins
        Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        {
            if ( !Scl_LibertyReadPinFormula(p, pPin) ) // skip input pin
                continue;
            assert( Scl_LibertyReadPinDirection(p, pPin) == 1 );
            pName = Scl_LibertyReadString(p, pPin->Head);
            Vec_StrPutS_( vOut, pName );
            Vec_StrPutF_( vOut, Scl_LibertyReadPinCap( p, pPin, "max_capacitance" ) );
            Vec_StrPutF_( vOut, Scl_LibertyReadPinCap( p, pPin, "max_transition" ) );
            Vec_StrPutI_( vOut, Vec_PtrSize(vNameIns) );
            pFormula = Scl_LibertyReadPinFormula(p, pPin);
            Vec_StrPutS_( vOut, pFormula );
            // write truth table
            vTruth = Mio_ParseFormulaTruth( pFormula, (char **)Vec_PtrArray(vNameIns), Vec_PtrSize(vNameIns) );
            if ( vTruth == NULL )
                return NULL;
            for ( i = 0; i < Abc_Truth6WordNum(Vec_PtrSize(vNameIns)); i++ )
                Vec_StrPutW_( vOut, Vec_WrdEntry(vTruth, i) );
            Vec_WrdFree( vTruth );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );

            // write the delay tables
            if ( fUseFirstTable )
            {
                Vec_PtrForEachEntry( char *, vNameIns, pName, i )
                {
                    pTiming = Scl_LibertyReadPinTiming( p, pPin, pName );
                    Vec_StrPutS_( vOut, pName );
                    Vec_StrPutI_( vOut, (int)(pTiming != NULL) );
                    if ( pTiming == NULL ) // output does not depend on input
                        continue;
                    Vec_StrPutI_( vOut, Scl_LibertyReadTimingSense(p, pTiming) );
                    Vec_StrPut_( vOut );
                    Vec_StrPut_( vOut );
                    // some cells only have 'rise' or 'fall' but not both - here we work around this
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_rise",           vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_fall",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_fall",           vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_rise",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "rise_transition",     vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "fall_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "fall_transition",     vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "rise_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }  
                }
                continue;
            }

            // write the timing tables
            Vec_PtrForEachEntry( char *, vNameIns, pName, i )
            {
                Vec_Ptr_t * vTables[4];
                Vec_Ptr_t * vTimings;
                vTimings = Scl_LibertyReadPinTimingAll( p, pPin, pName );
                Vec_StrPutS_( vOut, pName );
                Vec_StrPutI_( vOut, (int)(Vec_PtrSize(vTimings) != 0) );
                if ( Vec_PtrSize(vTimings) == 0 ) // output does not depend on input
                {
                    Vec_PtrFree( vTimings );
                    continue;
                }
                Vec_StrPutI_( vOut, Scl_LibertyReadTimingSense(p, (Scl_Item_t *)Vec_PtrEntry(vTimings, 0)) );
                Vec_StrPut_( vOut );
                Vec_StrPut_( vOut );
                // collect the timing tables
                for ( k = 0; k < 4; k++ )
                    vTables[k] = Vec_PtrAlloc( 16 );
                Vec_PtrForEachEntry( Scl_Item_t *, vTimings, pTiming, k )
                {
                    // some cells only have 'rise' or 'fall' but not both - here we work around this
                    if ( !Scl_LibertyScanTable( p, vTables[0], pTiming, "cell_rise",           vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[0], pTiming, "cell_fall",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[1], pTiming, "cell_fall",           vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[1], pTiming, "cell_rise",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[2], pTiming, "rise_transition",     vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[2], pTiming, "fall_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[3], pTiming, "fall_transition",     vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[3], pTiming, "rise_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }  
                }
                Vec_PtrFree( vTimings );
                // compute worse case of the tables
                for ( k = 0; k < 4; k++ )
                {
                    Vec_Flt_t * vInd0, * vInd1, * vValues;
                    if ( !Scl_LibertyComputeWorstCase( vTables[k], &vInd0, &vInd1, &vValues ) )
                        { printf( "Table indexes have different values\n" ); return NULL; }  
                    Vec_VecFree( (Vec_Vec_t *)vTables[k] );
                    Scl_LibertyDumpTables( vOut, vInd0, vInd1, vValues );
                    Vec_FltFree( vInd0 );
                    Vec_FltFree( vInd1 );
                    Vec_FltFree( vValues );
                }
            }
        }
        Vec_StrPut_( vOut );
        Vec_PtrFreeFree( vNameIns );
    }
    // free templates
    if ( vTemples )
    {
        Vec_Flt_t * vArray;
        assert( Vec_PtrSize(vTemples) % 4 == 0 );
        Vec_PtrForEachEntry( Vec_Flt_t *, vTemples, vArray, i )
            if ( i % 4 == 0 )
                ABC_FREE( vArray );
            else if ( i % 4 == 2 || i % 4 == 3 )
                Vec_FltFree( vArray );
        Vec_PtrFree( vTemples );
    }
    if ( fVerbose )
    {
        printf( "Library \"%s\" from \"%s\" has %d cells ", 
            Scl_LibertyReadString(p, Scl_LibertyRoot(p)->Head), p->pFileName, nCells );
        printf( "(%d skipped: %d seq; %d tri-state; %d no func).  ", 
            nSkipped[0]+nSkipped[1]+nSkipped[2], nSkipped[0], nSkipped[1], nSkipped[2] );
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    return vOut;
}